

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

void __thiscall
SimpleStringInternalCache::clearAllIncludingCurrentlyUsedMemory(SimpleStringInternalCache *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    destroySimpleStringMemoryBlockList
              (this,*(SimpleStringMemoryBlock **)((long)&this->cache_->freeMemoryHead_ + lVar2),
               *(size_t *)((long)&this->cache_->size_ + lVar2));
    destroySimpleStringMemoryBlockList
              (this,*(SimpleStringMemoryBlock **)((long)&this->cache_->usedMemoryHead_ + lVar2),
               *(size_t *)((long)&this->cache_->size_ + lVar2));
    puVar1 = (undefined8 *)((long)&this->cache_->freeMemoryHead_ + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x78);
  destroySimpleStringMemoryBlockList(this,this->nonCachedAllocations_,0);
  this->nonCachedAllocations_ = (SimpleStringMemoryBlock *)0x0;
  return;
}

Assistant:

void SimpleStringInternalCache::clearAllIncludingCurrentlyUsedMemory()
{
    for (size_t i = 0; i < amountOfInternalCacheNodes; i++) {
        destroySimpleStringMemoryBlockList(cache_[i].freeMemoryHead_, cache_[i].size_);
        destroySimpleStringMemoryBlockList(cache_[i].usedMemoryHead_, cache_[i].size_);
        cache_[i].freeMemoryHead_ = NULLPTR;
        cache_[i].usedMemoryHead_ = NULLPTR;
    }

    destroySimpleStringMemoryBlockList(nonCachedAllocations_, 0);
    nonCachedAllocations_ = NULLPTR;
}